

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O2

string * CxxModuleMapContent_abi_cxx11_
                   (string *__return_storage_ptr__,CxxModuleMapFormat format,CxxModuleLocations *loc
                   ,cmScanDepInfo *obj,CxxModuleUsage *usages)

{
  _Rb_tree_node_base *__x;
  pointer pcVar1;
  ostream *poVar2;
  const_iterator cVar3;
  size_type sVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  cmSourceReqInfo *p;
  pointer pcVar7;
  char *pcVar8;
  CxxModuleLocations *pCVar9;
  _Rb_tree_node_base *p_Var10;
  const_iterator __end1;
  static_string_view sVar11;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> bmi_loc
  ;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transitive_usage_names;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  stringstream mm;
  ostream local_1a8;
  
  if (format == Msvc) {
    std::__cxx11::stringstream::stringstream((stringstream *)&mm);
    pcVar7 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pcVar1 - (long)pcVar7) / 0x68) < 2) {
      for (; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1) {
        pcVar8 = "-internalPartition\n";
        if (pcVar7->IsInterface != false) {
          pcVar8 = "-interface\n";
        }
        std::operator<<(&local_1a8,pcVar8);
        CxxModuleLocations::BmiGeneratorPathForModule(&bmi_loc,loc,&pcVar7->LogicalName);
        if (bmi_loc.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          poVar2 = std::operator<<(&local_1a8,"-ifcOutput ");
          poVar2 = std::operator<<(poVar2,(string *)&bmi_loc);
          std::operator<<(poVar2,'\n');
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&bmi_loc);
      }
      bmi_loc.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_8_ =
           (long)&bmi_loc.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload + 8;
      bmi_loc.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length._0_4_ = 0;
      bmi_loc.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_8_ = 0;
      transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header;
      transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar1 = (obj->Requires).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bmi_loc.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_ = bmi_loc.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._24_8_;
      transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pcVar7 = (obj->Requires).
                    super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                    super__Vector_impl_data._M_start; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1) {
        pCVar9 = loc;
        CxxModuleLocations::BmiGeneratorPathForModule
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0,loc,&pcVar7->LogicalName);
        if (local_1e0._M_engaged == true) {
          sVar11 = anon_unknown.dwarf_1358698::CxxModuleMapContentMsvc::anon_class_1_0_00000001::
                   operator()((anon_class_1_0_00000001 *)(ulong)pcVar7->Method,(LookupMethod)pCVar9)
          ;
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (&local_1a8,sVar11.super_string_view._M_str,
                              sVar11.super_string_view._M_len);
          poVar2 = std::operator<<(poVar2,' ');
          poVar2 = std::operator<<(poVar2,(string *)pcVar7);
          poVar2 = std::operator<<(poVar2,'=');
          poVar2 = std::operator<<(poVar2,(string *)&local_1e0);
          std::operator<<(poVar2,"\n");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&bmi_loc,&pcVar7->LogicalName);
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)usages,&pcVar7->LogicalName);
          if ((_Rb_tree_header *)cVar3._M_node !=
              &(usages->Usage)._M_t._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&transitive_usage_names,cVar3._M_node[2]._M_right,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&cVar3._M_node[2]._M_parent);
          }
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_1e0);
      }
      for (p_Var6 = transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &transitive_usage_names._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        __x = p_Var6 + 1;
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&bmi_loc,(key_type *)__x);
        if (sVar4 == 0) {
          p_Var10 = __x;
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                  ::find(&(usages->Reference)._M_t,(key_type *)__x);
          if ((_Rb_tree_header *)cVar5._M_node !=
              &(usages->Reference)._M_t._M_impl.super__Rb_tree_header) {
            sVar11 = anon_unknown.dwarf_1358698::CxxModuleMapContentMsvc::anon_class_1_0_00000001::
                     operator()((anon_class_1_0_00000001 *)(ulong)cVar5._M_node[3]._M_color,
                                (LookupMethod)p_Var10);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (&local_1a8,sVar11.super_string_view._M_str,
                                sVar11.super_string_view._M_len);
            poVar2 = std::operator<<(poVar2,' ');
            poVar2 = std::operator<<(poVar2,(string *)__x);
            poVar2 = std::operator<<(poVar2,'=');
            poVar2 = std::operator<<(poVar2,(string *)(cVar5._M_node + 2));
            std::operator<<(poVar2,"\n");
          }
        }
      }
      std::__cxx11::stringbuf::str();
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&transitive_usage_names._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&bmi_loc);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  else {
    if (format != Gcc) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCxxModuleMapper.cxx"
                    ,0x132,
                    "std::string CxxModuleMapContent(CxxModuleMapFormat, const CxxModuleLocations &, const cmScanDepInfo &, const CxxModuleUsage &)"
                   );
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&mm);
    poVar2 = std::operator<<(&local_1a8,"$root ");
    poVar2 = std::operator<<(poVar2,(string *)loc);
    std::operator<<(poVar2,"\n");
    pcVar1 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pcVar7 = (obj->Provides).
                  super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1) {
      CxxModuleLocations::BmiGeneratorPathForModule(&bmi_loc,loc,&pcVar7->LogicalName);
      if (bmi_loc.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        poVar2 = std::operator<<(&local_1a8,(string *)pcVar7);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = std::operator<<(poVar2,(string *)&bmi_loc);
        std::operator<<(poVar2,'\n');
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&bmi_loc);
    }
    pcVar1 = (obj->Requires).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pcVar7 = (obj->Requires).
                  super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1) {
      CxxModuleLocations::BmiGeneratorPathForModule(&bmi_loc,loc,&pcVar7->LogicalName);
      if (bmi_loc.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        poVar2 = std::operator<<(&local_1a8,(string *)pcVar7);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = std::operator<<(poVar2,(string *)&bmi_loc);
        std::operator<<(poVar2,'\n');
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&bmi_loc);
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&mm);
  return __return_storage_ptr__;
}

Assistant:

std::string CxxModuleMapContent(CxxModuleMapFormat format,
                                CxxModuleLocations const& loc,
                                cmScanDepInfo const& obj,
                                CxxModuleUsage const& usages)
{
  switch (format) {
    case CxxModuleMapFormat::Gcc:
      return CxxModuleMapContentGcc(loc, obj);
    case CxxModuleMapFormat::Msvc:
      return CxxModuleMapContentMsvc(loc, obj, usages);
  }

  assert(false);
  return {};
}